

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::doAddClique
          (HighsCliqueTable *this,CliqueVar *cliquevars,HighsInt numcliquevars,bool equality,
          HighsInt origin)

{
  _Rb_tree_header *p_Var1;
  pointer *ppCVar2;
  pointer *ppCVar3;
  int *piVar4;
  pointer pCVar5;
  _Rb_tree_color _Var6;
  HighsInt HVar7;
  CliqueVar CVar8;
  pointer piVar9;
  iterator __position;
  pointer pCVar10;
  _Base_ptr p_Var11;
  Substitution SVar12;
  iterator iVar13;
  iterator __position_00;
  pointer pCVar14;
  const_iterator __position_01;
  uint uVar15;
  ValueType *pVVar16;
  int iVar17;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> pVar18;
  const_iterator cVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  bool bVar23;
  CliqueVar CVar24;
  ulong uVar25;
  pair<const_int_*,_bool> pVar26;
  pair<int_*,_bool> pVar27;
  HighsInt cliqueid;
  CliqueVar v;
  HighsInt k;
  CliqueVar local_6c;
  CliqueVar local_68;
  CliqueVar local_64;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> local_60;
  int local_58;
  uint local_54;
  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *local_50;
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  *local_48;
  ulong local_40;
  CliqueVar *local_38;
  
  piVar9 = (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_54 = numcliquevars;
  local_38 = cliquevars;
  if ((this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar9) {
    __position._M_current =
         (this->cliques).
         super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_6c = (CliqueVar)
               ((int)((ulong)((long)__position._M_current -
                             (long)(this->cliques).
                                   super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333);
    if (__position._M_current ==
        (this->cliques).
        super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
      _M_realloc_insert<>(&this->cliques,__position);
    }
    else {
      (__position._M_current)->start = 0;
      (__position._M_current)->end = 0;
      (__position._M_current)->origin = 0;
      (__position._M_current)->numZeroFixed = 0;
      *(undefined4 *)&(__position._M_current)->equality = 0;
      ppCVar2 = &(this->cliques).
                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar2 = *ppCVar2 + 1;
    }
  }
  else {
    local_6c = *(CliqueVar *)(piVar9 + -1);
    (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar9 + -1;
  }
  uVar22 = local_54;
  pCVar10 = (this->cliques).
            super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar10[(int)local_6c].equality = equality;
  pCVar10[(int)local_6c].origin = origin;
  local_48 = (_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&this->freespaces;
  if ((this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00260f0d:
    pCVar10[(int)local_6c].start =
         (HighsInt)
         ((ulong)((long)(this->cliqueentries).
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->cliqueentries).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
    pCVar10[(int)local_6c].end = pCVar10[(int)local_6c].start + local_54;
    local_58 = pCVar10[(int)local_6c].end;
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::resize
              (&this->cliqueentries,(long)local_58);
  }
  else {
    p_Var1 = &(this->freespaces)._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = (this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __position_01._M_node = &p_Var1->_M_header;
    for (; p_Var11 != (_Base_ptr)0x0; p_Var11 = *(_Base_ptr *)((long)&p_Var11->_M_color + lVar21)) {
      if (((int)p_Var11[1]._M_color < (int)local_54) ||
         ((lVar21 = 0x10, cVar19._M_node = p_Var11, (int)p_Var11[1]._M_color <= (int)local_54 &&
          (*(int *)&p_Var11[1].field_0x4 < -1)))) {
        lVar21 = 0x18;
        cVar19._M_node = __position_01._M_node;
      }
      __position_01._M_node = cVar19._M_node;
    }
    if ((_Rb_tree_header *)__position_01._M_node == p_Var1) goto LAB_00260f0d;
    _Var6 = __position_01._M_node[1]._M_color;
    HVar7 = *(HighsInt *)&__position_01._M_node[1].field_0x4;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::erase_abi_cxx11_(local_48,__position_01);
    pCVar10 = (this->cliques).
              super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar10[(int)local_6c].start = HVar7;
    pCVar10[(int)local_6c].end = pCVar10[(int)local_6c].start + uVar22;
    local_58 = _Var6 + pCVar10[(int)local_6c].start;
  }
  pCVar10 = (this->cliques).
            super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar10[(int)local_6c].numZeroFixed = 0;
  local_64 = (CliqueVar)pCVar10[(int)local_6c].start;
  if (uVar22 != 0) {
    local_50 = (vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
               &this->infeasvertexstack;
    local_40 = (ulong)uVar22;
    uVar25 = 0;
    bVar23 = false;
    do {
      local_68 = local_38[uVar25];
      piVar9 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar17 = piVar9[(uint)local_68 & 0x7fffffff];
      if (iVar17 != 0) {
        do {
          SVar12 = (this->substitutions).
                   super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)iVar17 + -1];
          local_68 = (CliqueVar)((uint)local_68 & 0x80000000 ^ 0x80000000 ^ (uint)SVar12.replace);
          iVar17 = *(int *)((long)piVar9 + ((ulong)SVar12 >> 0x1e & 0x1fffffffc));
        } while (iVar17 != 0);
      }
      if (bVar23) {
LAB_00261004:
        iVar13._M_current =
             (this->infeasvertexstack).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar13._M_current ==
            (this->infeasvertexstack).
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>(local_50,iVar13,&local_68);
        }
        else {
          *iVar13._M_current = local_68;
          ppCVar3 = &(this->infeasvertexstack).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar3 = *ppCVar3 + 1;
        }
      }
      else {
        uVar15 = (int)local_68 << 1 | (uint)((int)((uint)local_68 ^ 0x80000000) < 0);
        uVar20 = (ulong)(uint)local_6c * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                 (ulong)(uint)local_6c * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32;
        if (uVar22 == 2) {
          pVVar16 = HighsHashTree<int,_void>::find_recurse
                              ((NodePtr)(this->invertedHashListSizeTwo).
                                        super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar15].root.
                                        ptrAndType,uVar20,0,(int *)&local_6c);
        }
        else {
          pVVar16 = HighsHashTree<int,_int>::find_recurse
                              ((NodePtr)(this->invertedHashList).
                                        super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar15].root.
                                        ptrAndType,uVar20,0,(int *)&local_6c);
        }
        if (pVVar16 == (ValueType *)0x0) {
          uVar15 = (int)local_68 << 1 | (uint)((int)local_68 < 0);
          if (uVar22 == 2) {
            local_60.first = local_6c;
            pVar26 = HighsHashTree<int,_void>::insert_recurse
                               (&(this->invertedHashListSizeTwo).
                                 super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[(int)uVar15].root,
                                (ulong)(uint)local_6c * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                                0x20 ^ (ulong)(uint)local_6c * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,0,
                                (HighsHashTableEntry<int,_void> *)&local_60);
            uVar20 = pVar26._8_8_;
          }
          else {
            local_60.second = local_64;
            local_60.first = local_6c;
            pVar27 = HighsHashTree<int,_int>::insert_recurse
                               (&(this->invertedHashList).
                                 super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[(int)uVar15].root,
                                (ulong)(uint)local_6c * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                                0x20 ^ (ulong)(uint)local_6c * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,0,
                                (HighsHashTableEntry<int,_int> *)&local_60);
            uVar20 = pVar27._8_8_;
          }
          if ((uVar20 & 1) == 0) goto LAB_00261004;
          (this->cliqueentries).
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)local_64] = local_68;
          piVar4 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   (int)((int)local_68 << 1 | (uint)((int)local_68 < 0));
          *piVar4 = *piVar4 + 1;
          local_64 = (CliqueVar)((int)local_64 + 1);
        }
        else {
          CVar24 = (CliqueVar)
                   (this->cliques).
                   super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)local_6c].start;
          if (CVar24 != local_64) {
            lVar21 = (long)(int)CVar24 << 2;
            do {
              pCVar14 = (this->cliqueentries).
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              CVar8 = *(CliqueVar *)(&pCVar14->field_0x0 + lVar21);
              if ((((uint)local_68 ^ (uint)CVar8) & 0x7fffffff) != 0) {
                iVar13._M_current =
                     (this->infeasvertexstack).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar13._M_current ==
                    (this->infeasvertexstack).
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                            (local_50,iVar13,(CliqueVar *)(&pCVar14->field_0x0 + lVar21));
                }
                else {
                  *iVar13._M_current = CVar8;
                  ppCVar3 = &(this->infeasvertexstack).
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppCVar3 = *ppCVar3 + 1;
                }
              }
              unlink(this,(char *)(ulong)(uint)CVar24);
              CVar24 = (CliqueVar)((int)CVar24 + 1);
              lVar21 = lVar21 + 4;
            } while (CVar24 != local_64);
          }
          local_64 = (CliqueVar)
                     (this->cliques).
                     super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_6c].start;
          bVar23 = true;
          uVar22 = local_54;
        }
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != local_40);
  }
  if ((int)local_64 < local_58) {
    if (local_58 ==
        (int)((ulong)((long)(this->cliqueentries).
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->cliqueentries).
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::resize
                (&this->cliqueentries,(long)(int)local_64);
    }
    else {
      local_60.first = (CliqueVar)(local_58 - (int)local_64);
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_emplace_unique<int,int&>(local_48,(int *)&local_60,(int *)&local_64);
    }
    pCVar10 = (this->cliques).
              super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)local_64 < pCVar10[(int)local_6c].end) {
      pCVar5 = pCVar10 + (int)local_6c;
      CVar24 = (CliqueVar)pCVar5->start;
      if ((int)local_64 - (int)CVar24 != 2) {
        if ((int)local_64 - (int)CVar24 == 1) {
          unlink(this,(char *)(ulong)(uint)CVar24);
          pCVar10 = (this->cliques).
                    super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar10[(int)local_6c].start = -1;
          pCVar10[(int)local_6c].end = -1;
        }
        else {
          if (local_64 != CVar24) {
            pCVar5->end = (HighsInt)local_64;
            goto LAB_002613dc;
          }
          pCVar5->start = -1;
          pCVar10[(int)local_6c].end = -1;
        }
        __position_00._M_current =
             (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current !=
            (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *__position_00._M_current = (int)local_6c;
          (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          return;
        }
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->freeslots,__position_00,
                   (int *)&local_6c);
        return;
      }
      unlink(this,(char *)(ulong)(uint)CVar24);
      unlink(this,(char *)(ulong)((this->cliques).
                                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(int)local_6c].start + 1
                                 ));
      pCVar10 = (this->cliques).
                super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar10[(int)local_6c].end = (HighsInt)local_64;
      link(this,(char *)(ulong)(uint)pCVar10[(int)local_6c].start,(char *)(long)(int)local_6c);
      link(this,(char *)(ulong)((this->cliques).
                                super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)local_6c].start + 1),
           (char *)(long)(int)local_6c);
    }
  }
LAB_002613dc:
  lVar21 = (long)(int)local_6c;
  pCVar10 = (this->cliques).
            super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar17 = pCVar10[lVar21].end - pCVar10[lVar21].start;
  this->numEntries = this->numEntries + iVar17;
  if (iVar17 == 2) {
    pCVar14 = (this->cliqueentries).
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start;
    CVar24 = pCVar14[pCVar10[lVar21].start];
    CVar8 = pCVar14[(long)pCVar10[lVar21].start + 1];
    pVar18.second = CVar24;
    pVar18.first = CVar8;
    local_60 = (pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>)
               ((long)pVar18 << 0x20 | (ulong)(uint)CVar24);
    if (((uint)CVar8 & 0x7fffffff) < ((uint)CVar24 & 0x7fffffff)) {
      local_60 = pVar18;
    }
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>::
    insert<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int&>
              ((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>
                *)&this->sizeTwoCliques,&local_60,(int *)&local_6c);
  }
  return;
}

Assistant:

void HighsCliqueTable::doAddClique(const CliqueVar* cliquevars,
                                   HighsInt numcliquevars, bool equality,
                                   HighsInt origin) {
  HighsInt cliqueid;

  if (freeslots.empty()) {
    cliqueid = cliques.size();
    cliques.emplace_back();
  } else {
    cliqueid = freeslots.back();
    freeslots.pop_back();
  }

  cliques[cliqueid].equality = equality;
  cliques[cliqueid].origin = origin;

  std::set<std::pair<HighsInt, int>>::iterator it;
  HighsInt maxEnd;
  if (freespaces.empty() || (it = freespaces.lower_bound(std::make_pair(
                                 numcliquevars, -1))) == freespaces.end()) {
    cliques[cliqueid].start = cliqueentries.size();
    cliques[cliqueid].end = cliques[cliqueid].start + numcliquevars;
    maxEnd = cliques[cliqueid].end;
    cliqueentries.resize(cliques[cliqueid].end);
  } else {
    std::pair<HighsInt, int> freespace = *it;
    freespaces.erase(it);

    cliques[cliqueid].start = freespace.second;
    cliques[cliqueid].end = cliques[cliqueid].start + numcliquevars;
    maxEnd = cliques[cliqueid].start + freespace.first;
  }

  cliques[cliqueid].numZeroFixed = 0;

  bool fixtozero = false;
  HighsInt k = cliques[cliqueid].start;
  for (HighsInt i = 0; i != numcliquevars; ++i) {
    CliqueVar v = cliquevars[i];

    resolveSubstitution(v);

    if (fixtozero) {
      infeasvertexstack.push_back(v);
      continue;
    }

    // due to substitutions the variable may occur together with its complement
    // in this clique and we can fix all other variables in the clique to zero:
    //          x + ~x + ... <= 1
    //   <=> x + 1 - x + ... <= 1
    //   <=>             ... <= 0
    bool clqHasVCompl =
        numcliquevars == 2
            ? invertedHashListSizeTwo[v.complement().index()].contains(cliqueid)
            : invertedHashList[v.complement().index()].contains(cliqueid);

    if (clqHasVCompl) {
      fixtozero = true;
      for (HighsInt j = cliques[cliqueid].start; j != k; ++j) {
        if (cliqueentries[j].col != v.col)
          infeasvertexstack.push_back(cliqueentries[j]);
        unlink(j, cliqueid);
      }
      k = cliques[cliqueid].start;
      continue;
    }

    // due to substitutions the variable may occur twice in this clique and
    // we can fix it to zero:  x + x + ... <= 1  <=>  2x <= 1 <=> x <= 0.5 <=>
    // x = 0
    bool inserted;
    if (numcliquevars == 2)
      inserted = invertedHashListSizeTwo[v.index()].insert(cliqueid);
    else
      inserted = invertedHashList[v.index()].insert(cliqueid, k);

    if (!inserted) {
      infeasvertexstack.push_back(v);
      continue;
    }

    cliqueentries[k] = v;
    ++numcliquesvar[v.index()];
    ++k;
  }

  if (maxEnd > k) {
    if (int(cliqueentries.size()) == maxEnd)
      cliqueentries.resize(k);
    else
      freespaces.emplace(maxEnd - k, k);

    if (cliques[cliqueid].end > k) {
      switch (k - cliques[cliqueid].start) {
        case 0:
          // clique empty, so just mark it as deleted
          cliques[cliqueid].start = -1;
          cliques[cliqueid].end = -1;
          freeslots.push_back(cliqueid);
          return;
        case 1:
          // size 1 clique is redundant, so unlink the single linked entry
          // and mark it as deleted
          unlink(cliques[cliqueid].start, cliqueid);
          cliques[cliqueid].start = -1;
          cliques[cliqueid].end = -1;
          freeslots.push_back(cliqueid);
          return;
        case 2:
          // due to substitutions the clique became smaller and is now of size
          // two as a result we need to link it to the size two cliqueset
          // instead of the normal cliqueset
          assert(cliqueid >= 0 && cliqueid < (HighsInt)cliques.size());
          assert(cliques[cliqueid].start >= 0 &&
                 cliques[cliqueid].start < (HighsInt)cliqueentries.size());
          unlink(cliques[cliqueid].start, cliqueid);
          unlink(cliques[cliqueid].start + 1, cliqueid);

          cliques[cliqueid].end = k;

          link(cliques[cliqueid].start, cliqueid);
          link(cliques[cliqueid].start + 1, cliqueid);
          break;
        default:
          cliques[cliqueid].end = k;
      }
    }
  }

  HighsInt cliqueLen = cliques[cliqueid].end - cliques[cliqueid].start;
  numEntries += cliqueLen;
  if (cliqueLen == 2)
    sizeTwoCliques.insert(
        sortedEdge(cliqueentries[cliques[cliqueid].start],
                   cliqueentries[cliques[cliqueid].start + 1]),
        cliqueid);
}